

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::invalid_program_state(NegativeTestContext *ctx)

{
  undefined *puVar1;
  bool bVar2;
  ContextType ctxType;
  deUint32 dVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  ProgramSources *pPVar8;
  TestLog *pTVar9;
  TestError *this;
  char *local_7d0;
  allocator<char> local_7b9;
  string local_7b8;
  undefined1 local_792;
  allocator<char> local_791;
  string local_790;
  TestLog *local_770;
  TestLog *log;
  ProgramSources local_760;
  undefined1 local_690 [8];
  ShaderProgram tessEvalProgram;
  ProgramSources local_5b8;
  undefined1 local_4e8 [8];
  ShaderProgram tessCtrlProgram;
  ProgramSources local_410;
  undefined1 local_340 [8];
  ShaderProgram fragProgram;
  ProgramPipeline pipeline;
  string local_258;
  StringTemplate local_238;
  string local_218;
  undefined1 local_1f8 [8];
  TessellationEvaluationSource tessEvalSource;
  string local_1c8;
  StringTemplate local_1a8;
  string local_188;
  undefined1 local_168 [8];
  TessellationControlSource tessCtrlSource;
  string local_138;
  StringTemplate local_118;
  string local_f8;
  undefined1 local_d8 [8];
  FragmentSource frgSource;
  key_type local_a8;
  allocator<char> local_81;
  key_type local_80;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  checkTessellationSupport(ctx);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  if (bVar2) {
    local_7d0 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_7d0 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GLSL_VERSION_STRING",&local_81);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_80);
  std::__cxx11::string::operator=((string *)pmVar6,local_7d0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pcVar7 = "#extension GL_EXT_tessellation_shader : require";
  if (bVar2) {
    pcVar7 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"GLSL_TESS_EXTENSION_STRING",
             (allocator<char> *)(frgSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar7);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(frgSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,puVar1,
             (allocator<char> *)
             (tessCtrlSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate(&local_118,&local_138);
  tcu::StringTemplate::specialize
            (&local_f8,&local_118,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  tcu::StringTemplate::~StringTemplate(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             (tessCtrlSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  puVar1 = tessControlShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,puVar1,
             (allocator<char> *)
             (tessEvalSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate(&local_1a8,&local_1c8);
  tcu::StringTemplate::specialize
            (&local_188,&local_1a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_168,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  tcu::StringTemplate::~StringTemplate(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             (tessEvalSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  puVar1 = tessEvalShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,puVar1,(allocator<char> *)&pipeline.field_0xf);
  tcu::StringTemplate::StringTemplate(&local_238,&local_258);
  tcu::StringTemplate::specialize
            (&local_218,&local_238,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_1f8,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  tcu::StringTemplate::~StringTemplate(&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&pipeline.field_0xf);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramPipeline::ProgramPipeline
            ((ProgramPipeline *)&fragProgram.m_program.m_info.linkTimeUs,pRVar5);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_410);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&tessCtrlProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar8 = glu::ProgramSources::operator<<
                     (&local_410,
                      (ProgramSeparable *)((long)&tessCtrlProgram.m_program.m_info.linkTimeUs + 7));
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)local_d8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_340,pRVar5,pPVar8);
  glu::ProgramSources::~ProgramSources(&local_410);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_5b8);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&tessEvalProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar8 = glu::ProgramSources::operator<<
                     (&local_5b8,
                      (ProgramSeparable *)((long)&tessEvalProgram.m_program.m_info.linkTimeUs + 7));
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)local_168);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4e8,pRVar5,pPVar8);
  glu::ProgramSources::~ProgramSources(&local_5b8);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_760);
  glu::ProgramSeparable::ProgramSeparable((ProgramSeparable *)((long)&log + 7),true);
  pPVar8 = glu::ProgramSources::operator<<(&local_760,(ProgramSeparable *)((long)&log + 7));
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)local_1f8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_690,pRVar5,pPVar8);
  glu::ProgramSources::~ProgramSources(&local_760);
  local_770 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  pTVar9 = glu::operator<<(local_770,(ShaderProgram *)local_340);
  pTVar9 = glu::operator<<(pTVar9,(ShaderProgram *)local_4e8);
  glu::operator<<(pTVar9,(ShaderProgram *)local_690);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_340);
  if (((bVar2) && (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_4e8), bVar2)) &&
     (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_690), bVar2)) {
    dVar3 = glu::ProgramPipeline::getPipeline
                      ((ProgramPipeline *)&fragProgram.m_program.m_info.linkTimeUs);
    glu::CallLogWrapper::glBindProgramPipeline(&ctx->super_CallLogWrapper,dVar3);
    NegativeTestContext::expectError(ctx,0);
    dVar3 = glu::ProgramPipeline::getPipeline
                      ((ProgramPipeline *)&fragProgram.m_program.m_info.linkTimeUs);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
    glu::CallLogWrapper::glUseProgramStages(&ctx->super_CallLogWrapper,dVar3,2,dVar4);
    dVar3 = glu::ProgramPipeline::getPipeline
                      ((ProgramPipeline *)&fragProgram.m_program.m_info.linkTimeUs);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4e8);
    glu::CallLogWrapper::glUseProgramStages(&ctx->super_CallLogWrapper,dVar3,8,dVar4);
    dVar3 = glu::ProgramPipeline::getPipeline
                      ((ProgramPipeline *)&fragProgram.m_program.m_info.linkTimeUs);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_690);
    glu::CallLogWrapper::glUseProgramStages(&ctx->super_CallLogWrapper,dVar3,0x10,dVar4);
    NegativeTestContext::expectError(ctx,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b8,
               "GL_INVALID_OPERATION is generated if tessellation is active and vertex shader is missing."
               ,&local_7b9);
    NegativeTestContext::beginSection(ctx,&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator(&local_7b9);
    glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glBindProgramPipeline(&ctx->super_CallLogWrapper,0);
    NegativeTestContext::expectError(ctx,0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_690);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4e8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_340);
    glu::ProgramPipeline::~ProgramPipeline
              ((ProgramPipeline *)&fragProgram.m_program.m_info.linkTimeUs);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_1f8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)local_168);
    glu::FragmentSource::~FragmentSource((FragmentSource *)local_d8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
    return;
  }
  local_792 = 1;
  this = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"failed to build program",&local_791);
  tcu::TestError::TestError(this,&local_790);
  local_792 = 0;
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void invalid_program_state (NegativeTestContext& ctx)
{
	checkTessellationSupport(ctx);

	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]	= isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";

	glu::FragmentSource frgSource(tcu::StringTemplate(fragmentShaderSource).specialize(args));
	glu::TessellationControlSource tessCtrlSource(tcu::StringTemplate(tessControlShaderSource).specialize(args));
	glu::TessellationEvaluationSource tessEvalSource(tcu::StringTemplate(tessEvalShaderSource).specialize(args));

	glu::ProgramPipeline pipeline(ctx.getRenderContext());

	glu::ShaderProgram	fragProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << frgSource);
	glu::ShaderProgram	tessCtrlProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessCtrlSource);
	glu::ShaderProgram	tessEvalProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessEvalSource);

	tcu::TestLog& log = ctx.getLog();
	log << fragProgram << tessCtrlProgram << tessEvalProgram;

	if (!fragProgram.isOk() || !tessCtrlProgram.isOk() || !tessEvalProgram.isOk())
		throw tcu::TestError("failed to build program");

	ctx.glBindProgramPipeline(pipeline.getPipeline());
	ctx.expectError(GL_NO_ERROR);

	ctx.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, fragProgram.getProgram());
	ctx.glUseProgramStages(pipeline.getPipeline(), GL_TESS_CONTROL_SHADER_BIT, tessCtrlProgram.getProgram());
	ctx.glUseProgramStages(pipeline.getPipeline(), GL_TESS_EVALUATION_SHADER_BIT, tessEvalProgram.getProgram());
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if tessellation is active and vertex shader is missing.");
	ctx.glDrawArrays(GL_PATCHES, 0, 3);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glBindProgramPipeline(0);
	ctx.expectError(GL_NO_ERROR);
}